

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ImGuiTabBar *__src;
  int iVar4;
  ImGuiTabBar *__dest;
  int iVar5;
  
  uVar1 = (this->Buf).Size;
  uVar2 = this->FreeIdx;
  if (uVar2 == uVar1) {
    iVar4 = uVar1 + 1;
    iVar3 = (this->Buf).Capacity;
    if (iVar3 <= (int)uVar1) {
      if (iVar3 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar3 / 2 + iVar3;
      }
      if (iVar5 <= iVar4) {
        iVar5 = iVar4;
      }
      if (iVar3 < iVar5) {
        __dest = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar5 * 0x98);
        __src = (this->Buf).Data;
        if (__src != (ImGuiTabBar *)0x0) {
          memcpy(__dest,__src,(long)(this->Buf).Size * 0x98);
          ImGui::MemFree((this->Buf).Data);
        }
        (this->Buf).Data = __dest;
        (this->Buf).Capacity = iVar5;
      }
    }
    (this->Buf).Size = iVar4;
    iVar4 = this->FreeIdx + 1;
  }
  else {
    if (((int)uVar2 < 0) || ((int)uVar1 <= (int)uVar2)) goto LAB_001862f0;
    iVar4 = (this->Buf).Data[uVar2].Tabs.Size;
  }
  this->FreeIdx = iVar4;
  if ((-1 < (int)uVar2) && ((int)uVar2 < (this->Buf).Size)) {
    ImGuiTabBar::ImGuiTabBar((this->Buf).Data + uVar2);
    if ((int)uVar2 < (this->Buf).Size) {
      return (this->Buf).Data + uVar2;
    }
  }
LAB_001862f0:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                ,0x66a,"T &ImVector<ImGuiTabBar>::operator[](int) [T = ImGuiTabBar]");
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }